

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTest.cpp
# Opt level: O3

void __thiscall Basic_Empty_Test::~Basic_Empty_Test(Basic_Empty_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Basic, Empty) {

    {
        CLI::App app;
        input_t simpleput;
        app.parse(simpleput);
    }
    {
        CLI::App app;
        input_t spare = {"spare"};
        EXPECT_THROW(app.parse(spare), CLI::ExtrasError);
    }
    {
        CLI::App app;
        input_t simpleput;
        app.parse(simpleput);
    }
}